

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O3

void __thiscall duckdb::BuiltinFunctions::RegisterReadFunctions(BuiltinFunctions *this)

{
  pointer *ppRVar1;
  iterator __position;
  DBConfig *pDVar2;
  
  CSVCopyFunction::RegisterFunction(this);
  ReadCSVTableFunction::RegisterFunction(this);
  optional_ptr<duckdb::DatabaseInstance,_true>::CheckValid
            ((optional_ptr<duckdb::DatabaseInstance,_true> *)this);
  pDVar2 = DBConfig::GetConfig((this->transaction).db.ptr);
  __position._M_current =
       (pDVar2->replacement_scans).
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (pDVar2->replacement_scans).
      super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
      super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    (__position._M_current)->function = ReadCSVReplacement;
    ((__position._M_current)->data).
    super_unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ReplacementScanData_*,_std::default_delete<duckdb::ReplacementScanData>_>
    .super__Head_base<0UL,_duckdb::ReplacementScanData_*,_false>._M_head_impl =
         (ReplacementScanData *)0x0;
    ppRVar1 = &(pDVar2->replacement_scans).
               super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
               super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
    return;
  }
  ::std::vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>>::
  _M_realloc_insert<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>(&)(duckdb::ClientContext&,duckdb::ReplacementScanInput&,duckdb::optional_ptr<duckdb::ReplacementScanData,true>)>
            ((vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>> *)
             &pDVar2->replacement_scans,__position,ReadCSVReplacement);
  return;
}

Assistant:

void BuiltinFunctions::RegisterReadFunctions() {
	CSVCopyFunction::RegisterFunction(*this);
	ReadCSVTableFunction::RegisterFunction(*this);
	auto &config = DBConfig::GetConfig(*transaction.db);
	config.replacement_scans.emplace_back(ReadCSVReplacement);
}